

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

void djb::brdf::hd_to_io(vec3 *wh,vec3 *wd,vec3 *wi,vec3 *wo)

{
  float_t fVar1;
  vec3 vVar2;
  float_t phi_h;
  float_t theta_h;
  float_t local_94;
  vec3 *local_90;
  float_t local_84;
  vec3 local_80;
  vec3 local_70;
  vec3 local_60;
  vec3 local_50;
  vec3 local_40;
  
  local_40.x = 0.0;
  local_40.y = 1.0;
  local_40.z = 0.0;
  local_50.x = 0.0;
  local_50.y = 0.0;
  local_50.z = 1.0;
  local_90 = wo;
  xyz_to_theta_phi(wh,&local_84,&local_94);
  local_60 = rotate_vector(wd,&local_40,local_84);
  local_80 = rotate_vector(&local_60,&local_50,local_94);
  vVar2 = normalize(&local_80);
  *wi = vVar2;
  fVar1 = dot(wi,wh);
  local_70 = djb::operator*(fVar1 + fVar1,wh);
  local_80 = operator-(&local_70,wi);
  vVar2 = normalize(&local_80);
  *local_90 = vVar2;
  return;
}

Assistant:

void brdf::hd_to_io(const vec3 &wh, const vec3 &wd, vec3 *wi, vec3 *wo)
{
	const vec3 y = vec3(0, 1, 0);
	const vec3 z = vec3(0, 0, 1);
	float_t theta_h, phi_h;

	xyz_to_theta_phi(wh, &theta_h, &phi_h);
	vec3 tmp = rotate_vector(wd, y, theta_h);
	(*wi) = normalize(rotate_vector(tmp, z, phi_h));
	(*wo) = normalize(2 * dot((*wi), wh) * wh - (*wi));
}